

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VecAttributesImpl.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::VecAttributesImpl::getIndex
          (VecAttributesImpl *this,XMLCh *uri,XMLCh *localPart,XMLSize_t *index)

{
  XMLScanner *this_00;
  bool bVar1;
  uint uriId;
  MemoryManager *manager;
  XMLAttr *this_01;
  XMLCh *pXVar2;
  XMLAttr *curElem;
  XMLBuffer uriBuffer;
  XMLSize_t *index_local;
  XMLCh *localPart_local;
  XMLCh *uri_local;
  VecAttributesImpl *this_local;
  
  uriBuffer.fBuffer = (XMLCh *)index;
  manager = BaseRefVectorOf<xercesc_4_0::XMLAttr>::getMemoryManager
                      (&this->fVector->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>);
  XMLBuffer::XMLBuffer((XMLBuffer *)&curElem,0x3ff,manager);
  uriBuffer.fBuffer[0] = L'\0';
  uriBuffer.fBuffer[1] = L'\0';
  uriBuffer.fBuffer[2] = L'\0';
  uriBuffer.fBuffer[3] = L'\0';
  do {
    if (this->fCount <= *(ulong *)uriBuffer.fBuffer) {
      this_local._7_1_ = false;
LAB_00376b3d:
      XMLBuffer::~XMLBuffer((XMLBuffer *)&curElem);
      return this_local._7_1_;
    }
    this_01 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                        (&this->fVector->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,
                         *(XMLSize_t *)uriBuffer.fBuffer);
    this_00 = this->fScanner;
    uriId = XMLAttr::getURIId(this_01);
    XMLScanner::getURIText(this_00,uriId,(XMLBuffer *)&curElem);
    pXVar2 = XMLAttr::getName(this_01);
    bVar1 = XMLString::equals(pXVar2,localPart);
    if (bVar1) {
      pXVar2 = XMLBuffer::getRawBuffer((XMLBuffer *)&curElem);
      bVar1 = XMLString::equals(pXVar2,uri);
      if (bVar1) {
        this_local._7_1_ = true;
        goto LAB_00376b3d;
      }
    }
    *(long *)uriBuffer.fBuffer = *(long *)uriBuffer.fBuffer + 1;
  } while( true );
}

Assistant:

bool VecAttributesImpl::getIndex(const XMLCh* const uri,
                                 const XMLCh* const localPart,
                                 XMLSize_t& index) const
{
  //
  //  Search the vector for the attribute with the given name and return
  //  its type.
  //
  XMLBuffer uriBuffer(1023, fVector->getMemoryManager()) ;
  for (index = 0; index < fCount; index++)
  {
    const XMLAttr* curElem = fVector->elementAt(index);

    fScanner->getURIText(curElem->getURIId(), uriBuffer) ;

    if ( (XMLString::equals(curElem->getName(), localPart)) &&
         (XMLString::equals(uriBuffer.getRawBuffer(), uri)) )
      return true;
  }
  return false;
}